

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shared_ptr.hpp
# Opt level: O0

shared_ptr<boost::unit_test::decorator::base> * __thiscall
boost::shared_ptr<boost::unit_test::decorator::base>::operator=
          (shared_ptr<boost::unit_test::decorator::base> *this,
          shared_ptr<boost::unit_test::decorator::base> *r)

{
  shared_ptr<boost::unit_test::decorator::base> *in_RDI;
  shared_ptr<boost::unit_test::decorator::base> *in_stack_ffffffffffffffe0;
  
  shared_ptr(in_stack_ffffffffffffffe0,in_RDI);
  swap(in_stack_ffffffffffffffe0,in_RDI);
  ~shared_ptr((shared_ptr<boost::unit_test::decorator::base> *)0x28931e);
  return in_RDI;
}

Assistant:

shared_ptr & operator=( shared_ptr && r ) BOOST_SP_NOEXCEPT
    {
        this_type( static_cast< shared_ptr && >( r ) ).swap( *this );
        return *this;
    }